

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanValue(Scanner *this)

{
  int ToColumn;
  void *pvVar1;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  iVar2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
  I;
  ulong uVar3;
  long lVar4;
  iterator InsertPoint;
  bool bVar5;
  Token local_58;
  
  uVar3 = (ulong)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                 super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                 super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                 super_SmallVectorBase.Size;
  if (uVar3 == 0) {
    if (this->FlowLevel == 0) {
      rollIndent(this,this->Column,TK_BlockMappingStart,(iterator)&(this->TokenQueue).List);
      bVar5 = this->FlowLevel == 0;
    }
    else {
      bVar5 = false;
    }
    this->IsSimpleKeyAllowed = bVar5;
  }
  else {
    pvVar1 = (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    lVar4 = uVar3 * 0x18;
    iVar2.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )((ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
             *)((long)pvVar1 + lVar4 + -0x18))->NodePtr;
    ToColumn = *(int *)((long)pvVar1 + lVar4 + -0x10);
    SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::pop_back
              ((SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *)&this->SimpleKeys)
    ;
    local_58.Value._M_dataplus._M_p = (pointer)&local_58.Value.field_2;
    local_58.Value._M_string_length = 0;
    local_58.Value.field_2._M_local_buf[0] = '\0';
    local_58.Kind = TK_Key;
    local_58.Range.Data = *(char **)((long)iVar2.I.NodePtr + 0x18);
    local_58.Range.Length = *(size_t *)((long)iVar2.I.NodePtr + 0x20);
    I.NodePtr = &(this->TokenQueue).List.Sentinel.
                 super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
    ;
    do {
      I.NodePtr = *(node_pointer *)((long)I.NodePtr + 8);
      if ((list_type *)I.NodePtr == &(this->TokenQueue).List) {
        __assert_fail("i != e && \"SimpleKey not in token queue!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                      ,0x4cf,"bool llvm::yaml::Scanner::scanValue()");
      }
    } while ((ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
              )I.NodePtr != iVar2.I.NodePtr);
    InsertPoint = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                  ::insert(&this->TokenQueue,(iterator)I.NodePtr,&local_58);
    rollIndent(this,ToColumn,TK_BlockMappingStart,InsertPoint);
    this->IsSimpleKeyAllowed = false;
    std::__cxx11::string::_M_dispose();
  }
  local_58.Value._M_dataplus._M_p = (pointer)&local_58.Value.field_2;
  local_58.Value._M_string_length = 0;
  local_58.Value.field_2._M_local_buf[0] = '\0';
  local_58.Kind = TK_Value;
  local_58.Range.Data = this->Current;
  local_58.Range.Length = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_58);
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanValue() {
  // If the previous token could have been a simple key, insert the key token
  // into the token queue.
  if (!SimpleKeys.empty()) {
    SimpleKey SK = SimpleKeys.pop_back_val();
    Token T;
    T.Kind = Token::TK_Key;
    T.Range = SK.Tok->Range;
    TokenQueueT::iterator i, e;
    for (i = TokenQueue.begin(), e = TokenQueue.end(); i != e; ++i) {
      if (i == SK.Tok)
        break;
    }
    assert(i != e && "SimpleKey not in token queue!");
    i = TokenQueue.insert(i, T);

    // We may also need to add a Block-Mapping-Start token.
    rollIndent(SK.Column, Token::TK_BlockMappingStart, i);

    IsSimpleKeyAllowed = false;
  } else {
    if (!FlowLevel)
      rollIndent(Column, Token::TK_BlockMappingStart, TokenQueue.end());
    IsSimpleKeyAllowed = !FlowLevel;
  }

  Token T;
  T.Kind = Token::TK_Value;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}